

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_> *
__thiscall
array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>::operator=
          (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
           *this,array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
                 *other)

{
  CRuleCondition *pCVar1;
  CRuleCondition *pCVar2;
  long lVar3;
  int i;
  long lVar4;
  
  set_size(this,other->num_elements);
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < this->num_elements; lVar4 = lVar4 + 1) {
    pCVar1 = other->list;
    pCVar2 = this->list;
    *(undefined4 *)((long)&pCVar2->m_Value + lVar3) =
         *(undefined4 *)((long)&pCVar1->m_Value + lVar3);
    *(undefined8 *)((long)&pCVar2->m_X + lVar3) = *(undefined8 *)((long)&pCVar1->m_X + lVar3);
    lVar3 = lVar3 + 0xc;
  }
  return this;
}

Assistant:

array &operator = (const array &other)
	{
		set_size(other.size());
		for(int i = 0; i < size(); i++)
			(*this)[i] = other[i];
		return *this;
	}